

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  BombedMazeGame myBombedGame;
  MazeGame myGame;
  BombedMazeGame local_20 [8];
  undefined **local_18;
  
  local_18 = &PTR_MakeMaze_00103d68;
  MazeGame::CreateMaze();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BombedMazeGame::BombedMazeGame(local_20);
  MazeGame::CreateMaze();
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    MazeGame myGame;
    Maze* m1 = myGame.CreateMaze();
    std::cout << m1 << std::endl;

    BombedMazeGame myBombedGame;
    Maze* m2 = myBombedGame.CreateMaze();
    std::cout << m2 << std::endl;
}